

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_randomspawner.cpp
# Opt level: O3

void __thiscall ARandomSpawner::BeginPlay(ARandomSpawner *this)

{
  ActorFlags4 *pAVar1;
  BYTE *pBVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  uint uVar6;
  DDropItem *pDVar7;
  PClass *pPVar8;
  PClassActor *pPVar9;
  PClassActor *pPVar10;
  uint uVar11;
  ulong uVar12;
  DDropItem *pDVar13;
  DVector3 local_58;
  FName local_34;
  
  bVar3 = (level.flags2 & 0x8000) == 0;
  bVar4 = (dmflags.Value & 0x1000U) == 0;
  AActor::BeginPlay(&this->super_AActor);
  pDVar7 = AActor::GetDropItems(&this->super_AActor);
  if (pDVar7 != (DDropItem *)0x0) {
    uVar11 = 0;
    pDVar13 = pDVar7;
    do {
      iVar5 = (pDVar13->Name).Index;
      if (iVar5 != 0) {
        if (bVar3 && bVar4) {
LAB_004b9bfe:
          iVar5 = pDVar13->Amount;
          if (iVar5 < 0) {
            pDVar13->Amount = 1;
            iVar5 = 1;
          }
          uVar11 = uVar11 + iVar5;
        }
        else {
          local_58.X = (double)CONCAT44(local_58.X._4_4_,iVar5);
          pPVar8 = PClass::FindClass((FName *)&local_58);
          if ((pPVar8 == (PClass *)0x0) || ((*(uint *)(pPVar8->Defaults + 0x1c4) >> 0xd & 1) == 0))
          goto LAB_004b9bfe;
        }
        pDVar13 = pDVar13->Next;
      }
    } while (pDVar13 != (DDropItem *)0x0);
    if (uVar11 != 0) {
      uVar6 = FRandom::GenRand32(&pr_randomspawn);
      uVar12 = (ulong)uVar6 % (ulong)uVar11;
      pDVar13 = pDVar7;
      if (-1 < (int)uVar12) {
        do {
          iVar5 = (pDVar13->Name).Index;
          if (iVar5 == 0) {
LAB_004b9c91:
            pDVar7 = pDVar13->Next;
          }
          else {
            if (!bVar3 || !bVar4) {
              local_58.X = (double)CONCAT44(local_58.X._4_4_,iVar5);
              pPVar8 = PClass::FindClass((FName *)&local_58);
              if ((pPVar8 != (PClass *)0x0) &&
                 ((*(uint *)(pPVar8->Defaults + 0x1c4) >> 0xd & 1) != 0)) goto LAB_004b9c91;
            }
            uVar11 = (int)uVar12 - pDVar13->Amount;
            uVar12 = (ulong)uVar11;
            pDVar7 = pDVar13->Next;
            if (pDVar13->Next == (DDropItem *)0x0 || (int)uVar11 < 0) {
              uVar12 = 0xffffffff;
              pDVar7 = pDVar13;
            }
          }
        } while ((-1 < (int)uVar12) && (pDVar13 = pDVar7, pDVar7 != (DDropItem *)0x0));
      }
      if ((pDVar7 != (DDropItem *)0x0) && ((this->super_AActor).bouncecount < 0x20)) {
        uVar11 = FRandom::GenRand32(&pr_randomspawn);
        if (pDVar7->Probability < (int)(uVar11 & 0xff)) {
          return;
        }
        local_58.X = (double)CONCAT44(local_58.X._4_4_,(pDVar7->Name).Index);
        pPVar8 = PClass::FindClass((FName *)&local_58);
        pPVar9 = dyn_cast<PClassActor>((DObject *)pPVar8);
        if (pPVar9 != (PClassActor *)0x0) {
          pPVar10 = PClassActor::GetReplacement(pPVar9,true);
          if (pPVar10 == (PClassActor *)0x0) {
            pPVar10 = pPVar9;
          }
          (this->super_AActor).Species.super_FName.Index =
               (pPVar10->super_PClass).super_PNativeStruct.super_PStruct.super_PNamedType.TypeName.
               Index;
          pBVar2 = (pPVar10->super_PClass).Defaults;
          (this->super_AActor).Speed = *(double *)(pBVar2 + 0xe0);
          uVar12._0_4_ = (this->super_AActor).flags;
          uVar12._4_4_ = (this->super_AActor).flags2;
          uVar12 = uVar12 | *(ulong *)(pBVar2 + 0x1bc) & 0x4000000000010000;
          (this->super_AActor).flags = (ActorFlags)(int)uVar12;
          (this->super_AActor).flags2 = (ActorFlags2)(int)(uVar12 >> 0x20);
          pAVar1 = &(this->super_AActor).flags4;
          pAVar1->Value = pAVar1->Value | *(uint *)(pBVar2 + 0x1c8) & 0x40000;
          return;
        }
        Printf("\x1cGUnknown item class %s to drop from a random spawner\n",
               FName::NameData.NameArray[(pDVar7->Name).Index].Text);
        (this->super_AActor).Species.super_FName.Index = 0;
        return;
      }
      local_34.Index = FName::NameManager::FindName(&FName::NameData,"Unknown",false);
      local_58.X = (this->super_AActor).__Pos.X;
      local_58.Y = (this->super_AActor).__Pos.Y;
      local_58.Z = (this->super_AActor).__Pos.Z;
      pPVar9 = ClassForSpawn(&local_34);
      AActor::StaticSpawn(pPVar9,&local_58,NO_REPLACE,false);
    }
    (*(this->super_AActor).super_DThinker.super_DObject._vptr_DObject[4])(this);
  }
  return;
}

Assistant:

void BeginPlay()
	{
		DDropItem *di;   // di will be our drop item list iterator
		DDropItem *drop; // while drop stays as the reference point.
		int n = 0;
		bool nomonsters = (dmflags & DF_NO_MONSTERS) || (level.flags2 & LEVEL2_NOMONSTERS);

		Super::BeginPlay();
		drop = di = GetDropItems();
		if (di != NULL)
		{
			while (di != NULL)
			{
				if (di->Name != NAME_None)
				{
					if (!nomonsters || !IsMonster(di))
					{
						if (di->Amount < 0) di->Amount = 1; // default value is -1, we need a positive value.
						n += di->Amount; // this is how we can weight the list.
					}
					di = di->Next;
				}
			}
			if (n == 0)
			{ // Nothing left to spawn. They must have all been monsters, and monsters are disabled.
				Destroy();
				return;
			}
			// Then we reset the iterator to the start position...
			di = drop;
			// Take a random number...
			n = pr_randomspawn(n);
			// And iterate in the array up to the random number chosen.
			while (n > -1 && di != NULL)
			{
				if (di->Name != NAME_None &&
					(!nomonsters || !IsMonster(di)))
				{
					n -= di->Amount;
					if ((di->Next != NULL) && (n > -1))
						di = di->Next;
					else
						n = -1;
				}
				else
				{
					di = di->Next;
				}
			}
			// So now we can spawn the dropped item.
			if (di == NULL || bouncecount >= MAX_RANDOMSPAWNERS_RECURSION)	// Prevents infinite recursions
			{
				Spawn("Unknown", Pos(), NO_REPLACE);		// Show that there's a problem.
				Destroy();
				return;
			}
			else if (pr_randomspawn() <= di->Probability)	// prob 255 = always spawn, prob 0 = almost never spawn.
			{
				// Handle replacement here so as to get the proper speed and flags for missiles
				PClassActor *cls;
				cls = PClass::FindActor(di->Name);
				if (cls != NULL)
				{
					PClassActor *rep = cls->GetReplacement();
					if (rep != NULL)
					{
						cls = rep;
					}
				}
				if (cls != NULL)
				{
					Species = cls->TypeName;
					AActor *defmobj = GetDefaultByType(cls);
					this->Speed = defmobj->Speed;
					this->flags  |= (defmobj->flags  & MF_MISSILE);
					this->flags2 |= (defmobj->flags2 & MF2_SEEKERMISSILE);
					this->flags4 |= (defmobj->flags4 & MF4_SPECTRAL);
				}
				else
				{
					Printf(TEXTCOLOR_RED "Unknown item class %s to drop from a random spawner\n", di->Name.GetChars());
					Species = NAME_None;
				}
			}
		}
	}